

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Type * find_typedef(C_Parser *parser,C_Token *tok)

{
  C_VarScope *pCVar1;
  C_VarScope *sc;
  C_Token *tok_local;
  C_Parser *parser_local;
  
  if ((tok->kind == TK_IDENT) && (pCVar1 = find_var(parser,tok), pCVar1 != (C_VarScope *)0x0)) {
    parser_local = (C_Parser *)pCVar1->type_def;
  }
  else {
    parser_local = (C_Parser *)0x0;
  }
  return (C_Type *)parser_local;
}

Assistant:

static C_Type *find_typedef(C_Parser *parser, C_Token *tok) {
  if (tok->kind == TK_IDENT) {
    C_VarScope *sc = find_var(parser, tok);
    if (sc)
      return sc->type_def;
  }
  return NULL;
}